

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

int kj::TlsConnection::bioRead(BIO *b,char *out,int outl)

{
  int iVar1;
  char local_30;
  int local_28;
  
  BIO_clear_flags((BIO *)b,0xf);
  iVar1 = BIO_get_data(b);
  ReadyInputStreamWrapper::read
            ((ReadyInputStreamWrapper *)&stack0xffffffffffffffd0,iVar1 + 0x40,out,(long)outl);
  if (local_30 != '\x01') {
    BIO_set_flags((BIO *)b,9);
    local_28 = -1;
  }
  return local_28;
}

Assistant:

static int bioRead(BIO* b, char* out, int outl) {
    BIO_clear_retry_flags(b);
    KJ_IF_SOME(n, reinterpret_cast<TlsConnection*>(BIO_get_data(b))->readBuffer
        .read(kj::arrayPtr(out, outl).asBytes())) {
      return n;
    } else {
      BIO_set_retry_read(b);
      return -1;
    }